

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFanout.c
# Opt level: O3

void Ivy_ObjCollectFanouts(Ivy_Man_t *p,Ivy_Obj_t *pObj,Vec_Ptr_t *vArray)

{
  void **ppvVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  Ivy_Obj_t *pIVar6;
  
  if (p->fFanout == 0) {
    __assert_fail("p->fFanout",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                  ,0x109,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
  }
  if (((ulong)pObj & 1) == 0) {
    vArray->nSize = 0;
    pIVar6 = pObj->pFanout;
    if (pIVar6 != (Ivy_Obj_t *)0x0) {
      uVar5 = (ulong)(uint)vArray->nCap;
      iVar3 = 0;
      do {
        iVar4 = (int)uVar5;
        if (iVar3 == iVar4) {
          if (iVar4 < 0x10) {
            if (vArray->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc(0x80);
            }
            else {
              ppvVar1 = (void **)realloc(vArray->pArray,0x80);
            }
            vArray->pArray = ppvVar1;
            vArray->nCap = 0x10;
            uVar5 = 0x10;
          }
          else {
            uVar5 = (ulong)(uint)(iVar4 * 2);
            if (vArray->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc(uVar5 * 8);
            }
            else {
              ppvVar1 = (void **)realloc(vArray->pArray,uVar5 * 8);
            }
            vArray->pArray = ppvVar1;
            vArray->nCap = iVar4 * 2;
          }
        }
        else {
          ppvVar1 = vArray->pArray;
        }
        iVar4 = vArray->nSize;
        iVar3 = iVar4 + 1;
        vArray->nSize = iVar3;
        ppvVar1[iVar4] = pIVar6;
        if (((ulong)pIVar6 & 1) != 0) {
          __assert_fail("!Ivy_IsComplement(pFanout)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                        ,0x22,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
        }
        if ((Ivy_Obj_t *)((ulong)pIVar6->pFanin0 & 0xfffffffffffffffe) == pObj) {
          lVar2 = 0x28;
        }
        else {
          lVar2 = 0x30;
          if ((Ivy_Obj_t *)((ulong)pIVar6->pFanin1 & 0xfffffffffffffffe) != pObj) {
            __assert_fail("Ivy_ObjFanin1(pFanout) == pObj",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                          ,0x27,"Ivy_Obj_t *Ivy_ObjNextFanout(Ivy_Obj_t *, Ivy_Obj_t *)");
          }
        }
        pIVar6 = *(Ivy_Obj_t **)((long)&pIVar6->Id + lVar2);
      } while (pIVar6 != (Ivy_Obj_t *)0x0);
    }
    return;
  }
  __assert_fail("!Ivy_IsComplement(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyFanout.c"
                ,0x10a,"void Ivy_ObjCollectFanouts(Ivy_Man_t *, Ivy_Obj_t *, Vec_Ptr_t *)");
}

Assistant:

void Ivy_ObjCollectFanouts( Ivy_Man_t * p, Ivy_Obj_t * pObj, Vec_Ptr_t * vArray )
{
    Ivy_Obj_t * pFanout;
    assert( p->fFanout );
    assert( !Ivy_IsComplement(pObj) );
    Vec_PtrClear( vArray );
    Ivy_ObjForEachFanoutInt( pObj, pFanout )
        Vec_PtrPush( vArray, pFanout );
}